

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O0

void secp256k1_scalar_split_lambda_verify
               (secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  int iVar1;
  bool bVar2;
  uchar buf2 [32];
  uchar buf1 [32];
  secp256k1_scalar s;
  secp256k1_scalar *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_scalar *in_stack_ffffffffffffffb8;
  secp256k1_scalar *in_stack_ffffffffffffffc0;
  
  secp256k1_scalar_mul
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_scalar_add
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)
                              CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
                                      ),in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/scalar_impl.h"
            ,0x132,"test condition failed: secp256k1_scalar_eq(&s, k)");
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(in_stack_ffffffffffffff87,
                               CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             in_stack_ffffffffffffff78);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(in_stack_ffffffffffffff87,
                               CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             in_stack_ffffffffffffff78);
  iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffffa8,"",0x20);
  uVar3 = true;
  if (-1 < iVar1) {
    iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffff88,"",0x20);
    uVar3 = iVar1 < 0;
  }
  if (((uVar3 ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/scalar_impl.h"
            ,0x137,
            "test condition failed: secp256k1_memcmp_var(buf1, k1_bound, 32) < 0 || secp256k1_memcmp_var(buf2, k1_bound, 32) < 0"
           );
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             in_stack_ffffffffffffff78);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             in_stack_ffffffffffffff78);
  iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffffa8,"",0x20);
  bVar2 = true;
  if (-1 < iVar1) {
    iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffff88,"",0x20);
    bVar2 = iVar1 < 0;
  }
  if (!bVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/scalar_impl.h"
            ,0x13c,
            "test condition failed: secp256k1_memcmp_var(buf1, k2_bound, 32) < 0 || secp256k1_memcmp_var(buf2, k2_bound, 32) < 0"
           );
    abort();
  }
  return;
}

Assistant:

static void secp256k1_scalar_split_lambda_verify(const secp256k1_scalar *r1, const secp256k1_scalar *r2, const secp256k1_scalar *k) {
    secp256k1_scalar s;
    unsigned char buf1[32];
    unsigned char buf2[32];

    /* (a1 + a2 + 1)/2 is 0xa2a8918ca85bafe22016d0b917e4dd77 */
    static const unsigned char k1_bound[32] = {
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0xa2, 0xa8, 0x91, 0x8c, 0xa8, 0x5b, 0xaf, 0xe2, 0x20, 0x16, 0xd0, 0xb9, 0x17, 0xe4, 0xdd, 0x77
    };

    /* (-b1 + b2)/2 + 1 is 0x8a65287bd47179fb2be08846cea267ed */
    static const unsigned char k2_bound[32] = {
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x8a, 0x65, 0x28, 0x7b, 0xd4, 0x71, 0x79, 0xfb, 0x2b, 0xe0, 0x88, 0x46, 0xce, 0xa2, 0x67, 0xed
    };

    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, r2);
    secp256k1_scalar_add(&s, &s, r1);
    VERIFY_CHECK(secp256k1_scalar_eq(&s, k));

    secp256k1_scalar_negate(&s, r1);
    secp256k1_scalar_get_b32(buf1, r1);
    secp256k1_scalar_get_b32(buf2, &s);
    VERIFY_CHECK(secp256k1_memcmp_var(buf1, k1_bound, 32) < 0 || secp256k1_memcmp_var(buf2, k1_bound, 32) < 0);

    secp256k1_scalar_negate(&s, r2);
    secp256k1_scalar_get_b32(buf1, r2);
    secp256k1_scalar_get_b32(buf2, &s);
    VERIFY_CHECK(secp256k1_memcmp_var(buf1, k2_bound, 32) < 0 || secp256k1_memcmp_var(buf2, k2_bound, 32) < 0);
}